

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O2

constant_type * __thiscall
winmd::reader::Constant::Value(constant_type *__return_storage_ptr__,Constant *this)

{
  bool bVar1;
  __index_type _Var2;
  char cVar3;
  uchar uVar4;
  ConstantType CVar5;
  short sVar6;
  char16_t cVar7;
  unsigned_short uVar8;
  uint uVar9;
  int iVar10;
  unsigned_long uVar11;
  long lVar12;
  float fVar13;
  double dVar14;
  u16string_view uVar15;
  allocator<char> local_31;
  string local_30;
  
  CVar5 = Type(this);
  switch(CVar5) {
  case Boolean:
    bVar1 = ValueBoolean(this);
    *(bool *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = bVar1;
    _Var2 = '\0';
    break;
  case Char:
    cVar7 = ValueChar(this);
    *(char16_t *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = cVar7;
    _Var2 = '\x01';
    break;
  case Int8:
    cVar3 = ValueInt8(this);
    *(char *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = cVar3;
    _Var2 = '\x02';
    break;
  case UInt8:
    uVar4 = ValueUInt8(this);
    *(uchar *)&(__return_storage_ptr__->
               super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
               ).
               super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               ._M_u = uVar4;
    _Var2 = '\x03';
    break;
  case Int16:
    sVar6 = ValueInt16(this);
    *(short *)&(__return_storage_ptr__->
               super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
               ).
               super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               ._M_u = sVar6;
    _Var2 = '\x04';
    break;
  case UInt16:
    uVar8 = ValueUInt16(this);
    *(unsigned_short *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = uVar8;
    _Var2 = '\x05';
    break;
  case Int32:
    iVar10 = ValueInt32(this);
    *(int *)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
             ).
             super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             .
             super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
             ._M_u = iVar10;
    _Var2 = '\x06';
    break;
  case UInt32:
    uVar9 = ValueUInt32(this);
    *(uint *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = uVar9;
    _Var2 = '\a';
    break;
  case Int64:
    lVar12 = ValueInt64(this);
    *(long *)&(__return_storage_ptr__->
              super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
              ).
              super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              .
              super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
              ._M_u = lVar12;
    _Var2 = '\b';
    break;
  case UInt64:
    uVar11 = ValueUInt64(this);
    *(unsigned_long *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = uVar11;
    _Var2 = '\t';
    break;
  case Float32:
    fVar13 = ValueFloat32(this);
    *(float *)&(__return_storage_ptr__->
               super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
               ).
               super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               .
               super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
               ._M_u = fVar13;
    _Var2 = '\n';
    break;
  case Float64:
    dVar14 = ValueFloat64(this);
    *(double *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = dVar14;
    _Var2 = '\v';
    break;
  case String:
    uVar15 = ValueString(this);
    (__return_storage_ptr__->
    super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
    ).
    super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
    .
    super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
    .
    super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
    .
    super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
    .
    super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
    ._M_u = (_Variadic_union<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
             )uVar15;
    _Var2 = '\f';
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Invalid constant type",&local_31);
    impl::throw_invalid(&local_30);
  case Class:
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
      ).
      super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      .
      super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
      ._M_u = 0;
    _Var2 = '\r';
  }
  (__return_storage_ptr__->
  super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
  ).
  super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  .
  super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
  ._M_index = _Var2;
  return __return_storage_ptr__;
}

Assistant:

inline Constant::constant_type Constant::Value() const
    {
        switch (Type())
        {
        case ConstantType::Boolean:
            return ValueBoolean();
        case ConstantType::Char:
            return ValueChar();
        case ConstantType::Int8:
            return ValueInt8();
        case ConstantType::UInt8:
            return ValueUInt8();
        case ConstantType::Int16:
            return ValueInt16();
        case ConstantType::UInt16:
            return ValueUInt16();
        case ConstantType::Int32:
            return ValueInt32();
        case ConstantType::UInt32:
            return ValueUInt32();
        case ConstantType::Int64:
            return ValueInt64();
        case ConstantType::UInt64:
            return ValueUInt64();
        case ConstantType::Float32:
            return ValueFloat32();
        case ConstantType::Float64:
            return ValueFloat64();
        case ConstantType::String:
            return ValueString();
        case ConstantType::Class:
            return ValueClass();
        default:
            impl::throw_invalid("Invalid constant type");
        }
    }